

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_7::Validator::OnReturnCallIndirectExpr
          (Validator *this,ReturnCallIndirectExpr *expr)

{
  Location *loc;
  
  loc = &(expr->super_ExprMixin<(wabt::ExprType)33>).super_Expr.loc;
  this->expr_loc_ = loc;
  if ((this->current_module_->tables).
      super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->current_module_->tables).
      super__Vector_base<wabt::Table_*,_std::allocator<wabt::Table_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    PrintError(this,loc,"found return_call_indirect operator, but no table");
  }
  CheckFuncSignature(this,loc,&expr->decl);
  TypeChecker::OnReturnCallIndirect
            (&this->typechecker_,&(expr->decl).sig.param_types,&(expr->decl).sig.result_types);
  return (Result)Ok;
}

Assistant:

Result Validator::OnReturnCallIndirectExpr(ReturnCallIndirectExpr* expr) {
  expr_loc_ = &expr->loc;
  if (current_module_->tables.empty()) {
    PrintError(&expr->loc, "found return_call_indirect operator, but no table");
  }
  CheckFuncSignature(&expr->loc, expr->decl);
  typechecker_.OnReturnCallIndirect(expr->decl.sig.param_types,
                              expr->decl.sig.result_types);
  return Result::Ok;
}